

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall
soplex::
CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::solveUleftNoNZ(CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                 *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *eps,
                number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                *vec,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *rhs,int *rhsidx,int rhsn)

{
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *pnVar1;
  uint *puVar2;
  int iVar3;
  fpclass_type fVar4;
  int32_t iVar5;
  undefined8 uVar6;
  cpp_dec_float<50U,_int,_void> *pcVar7;
  cpp_dec_float<50U,_int,_void> *pcVar8;
  cpp_dec_float<50U,_int,_void> *pcVar9;
  cpp_dec_float<50U,_int,_void> *pcVar10;
  bool bVar11;
  type_conflict5 tVar12;
  int iVar13;
  cpp_dec_float<50U,_int,_void> *v;
  long lVar14;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result_1;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  int local_29c;
  cpp_dec_float<50U,_int,_void> local_298;
  cpp_dec_float<50U,_int,_void> local_258;
  int *local_218;
  int local_20c;
  cpp_dec_float<50U,_int,_void> local_208;
  CLUFactor<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_1d0;
  int *local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_1c0;
  int *local_1b8;
  int *local_1b0;
  int *local_1a8;
  pointer local_1a0;
  int *local_198;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  *local_190;
  int *local_188;
  int *local_180;
  ulong local_178;
  long local_170;
  cpp_dec_float<50U,_int,_void> local_168;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_e8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_a8;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_68;
  
  local_298.fpclass = cpp_dec_float_finite;
  local_298.prec_elem = 10;
  local_298.data._M_elems[0] = 0;
  local_298.data._M_elems[1] = 0;
  local_298.data._M_elems[2] = 0;
  local_298.data._M_elems[3] = 0;
  local_298.data._M_elems[4] = 0;
  local_298.data._M_elems[5] = 0;
  local_298.data._M_elems._24_5_ = 0;
  local_298.data._M_elems[7]._1_3_ = 0;
  local_298.data._M_elems._32_5_ = 0;
  local_298.data._M_elems[9]._1_3_ = 0;
  local_298.exp = 0;
  local_298.neg = false;
  local_198 = (this->row).orig;
  local_188 = (this->col).orig;
  local_1c8 = (this->col).perm;
  local_20c = 0;
  local_29c = rhsn;
  local_218 = rhsidx;
  local_1d0 = this;
  local_1c0 = eps;
  local_190 = vec;
  while (local_20c < rhsn) {
    enQueueMin(local_218,&local_20c,local_1c8[local_218[local_20c]]);
  }
  local_1a0 = (local_1d0->u).row.val.
              super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1a8 = (local_1d0->u).row.idx;
  local_1b0 = (local_1d0->u).row.len;
  local_1b8 = (local_1d0->u).row.start;
  while (0 < rhsn) {
    iVar13 = deQueueMin(local_218,&local_29c);
    iVar3 = local_188[iVar13];
    local_208.data._M_elems._32_8_ = *(undefined8 *)(rhs[iVar3].m_backend.data._M_elems + 8);
    local_208.data._M_elems._0_8_ = *(undefined8 *)rhs[iVar3].m_backend.data._M_elems;
    local_208.data._M_elems._8_8_ = *(undefined8 *)(rhs[iVar3].m_backend.data._M_elems + 2);
    puVar2 = rhs[iVar3].m_backend.data._M_elems + 4;
    local_208.data._M_elems._16_8_ = *(undefined8 *)puVar2;
    local_208.data._M_elems._24_8_ = *(undefined8 *)(puVar2 + 2);
    local_208.exp = rhs[iVar3].m_backend.exp;
    local_208.neg = rhs[iVar3].m_backend.neg;
    local_208.fpclass = rhs[iVar3].m_backend.fpclass;
    local_208.prec_elem = rhs[iVar3].m_backend.prec_elem;
    boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
              (&rhs[iVar3].m_backend,0);
    local_68.m_backend.data._M_elems[0] = local_208.data._M_elems[0];
    local_68.m_backend.data._M_elems[1] = local_208.data._M_elems[1];
    local_68.m_backend.data._M_elems[2] = local_208.data._M_elems[2];
    local_68.m_backend.data._M_elems[3] = local_208.data._M_elems[3];
    local_68.m_backend.data._M_elems[4] = local_208.data._M_elems[4];
    local_68.m_backend.data._M_elems[5] = local_208.data._M_elems[5];
    local_68.m_backend.data._M_elems[6] = local_208.data._M_elems[6];
    local_68.m_backend.data._M_elems[7] = local_208.data._M_elems[7];
    local_68.m_backend.data._M_elems[8] = local_208.data._M_elems[8];
    local_68.m_backend.data._M_elems[9] = local_208.data._M_elems[9];
    local_68.m_backend.exp = local_208.exp;
    local_68.m_backend.neg = local_208.neg;
    local_68.m_backend.fpclass = local_208.fpclass;
    local_68.m_backend.prec_elem = local_208.prec_elem;
    local_a8.m_backend.data._M_elems._0_8_ = *(undefined8 *)(local_1c0->m_backend).data._M_elems;
    local_a8.m_backend.data._M_elems._8_8_ =
         *(undefined8 *)((local_1c0->m_backend).data._M_elems + 2);
    local_a8.m_backend.data._M_elems._16_8_ =
         *(undefined8 *)((local_1c0->m_backend).data._M_elems + 4);
    local_a8.m_backend.data._M_elems._24_8_ =
         *(undefined8 *)((local_1c0->m_backend).data._M_elems + 6);
    local_a8.m_backend.data._M_elems._32_8_ =
         *(undefined8 *)((local_1c0->m_backend).data._M_elems + 8);
    local_a8.m_backend.exp = (local_1c0->m_backend).exp;
    local_a8.m_backend.neg = (local_1c0->m_backend).neg;
    local_a8.m_backend.fpclass = (local_1c0->m_backend).fpclass;
    local_a8.m_backend.prec_elem = (local_1c0->m_backend).prec_elem;
    bVar11 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                       (&local_68,&local_a8);
    rhsn = local_29c;
    if (bVar11) {
      iVar3 = local_198[iVar13];
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=
                (&local_208,
                 &(local_1d0->diag).
                  super__Vector_base<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>,_std::allocator<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar3].m_backend);
      *(undefined8 *)local_190[iVar3].m_backend.data._M_elems = local_208.data._M_elems._0_8_;
      *(undefined8 *)(local_190[iVar3].m_backend.data._M_elems + 2) = local_208.data._M_elems._8_8_;
      puVar2 = local_190[iVar3].m_backend.data._M_elems + 4;
      *(undefined8 *)puVar2 = local_208.data._M_elems._16_8_;
      *(undefined8 *)(puVar2 + 2) = local_208.data._M_elems._24_8_;
      *(undefined8 *)(local_190[iVar3].m_backend.data._M_elems + 8) = local_208.data._M_elems._32_8_
      ;
      local_190[iVar3].m_backend.exp = local_208.exp;
      local_190[iVar3].m_backend.neg = local_208.neg;
      local_190[iVar3].m_backend.fpclass = local_208.fpclass;
      local_190[iVar3].m_backend.prec_elem = local_208.prec_elem;
      local_180 = local_1a8 + local_1b8[iVar3];
      v = &local_1a0[local_1b8[iVar3]].m_backend;
      local_178 = (ulong)(uint)local_1b0[iVar3];
      for (lVar14 = 0; rhsn = local_29c, (int)local_178 != (int)lVar14; lVar14 = lVar14 + 1) {
        local_170 = (long)local_180[lVar14];
        pnVar1 = rhs + local_170;
        uVar6 = *(undefined8 *)(rhs[local_170].m_backend.data._M_elems + 8);
        local_298.data._M_elems._32_5_ = SUB85(uVar6,0);
        local_298.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_298.data._M_elems._0_8_ = *(undefined8 *)rhs[local_170].m_backend.data._M_elems;
        local_298.data._M_elems._8_8_ = *(undefined8 *)(rhs[local_170].m_backend.data._M_elems + 2);
        puVar2 = rhs[local_170].m_backend.data._M_elems + 4;
        local_298.data._M_elems._16_8_ = *(undefined8 *)puVar2;
        uVar6 = *(undefined8 *)(puVar2 + 2);
        local_298.data._M_elems._24_5_ = SUB85(uVar6,0);
        local_298.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar6 >> 0x28);
        local_298.exp = rhs[local_170].m_backend.exp;
        local_298.neg = rhs[local_170].m_backend.neg;
        local_298.fpclass = rhs[local_170].m_backend.fpclass;
        local_298.prec_elem = rhs[local_170].m_backend.prec_elem;
        local_258.data._M_elems._0_8_ = local_258.data._M_elems._0_8_ & 0xffffffff00000000;
        tVar12 = boost::multiprecision::operator==
                           ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                             *)&local_298,(int *)&local_258);
        if (tVar12) {
          local_168.data._M_elems[0] = local_208.data._M_elems[0];
          local_168.data._M_elems[1] = local_208.data._M_elems[1];
          uVar6 = local_168.data._M_elems._0_8_;
          local_168.data._M_elems[2] = local_208.data._M_elems[2];
          local_168.data._M_elems[3] = local_208.data._M_elems[3];
          local_168.data._M_elems[8] = local_208.data._M_elems[8];
          local_168.data._M_elems[9] = local_208.data._M_elems[9];
          local_168.data._M_elems[4] = local_208.data._M_elems[4];
          local_168.data._M_elems[5] = local_208.data._M_elems[5];
          local_168.data._M_elems[6] = local_208.data._M_elems[6];
          local_168.data._M_elems[7] = local_208.data._M_elems[7];
          local_168.exp = local_208.exp;
          local_168.neg = local_208.neg;
          local_168.fpclass = local_208.fpclass;
          local_168.prec_elem = local_208.prec_elem;
          local_168.data._M_elems[0] = local_208.data._M_elems[0];
          if (local_208.fpclass != cpp_dec_float_finite || local_168.data._M_elems[0] != 0) {
            local_168.neg = (bool)(local_208.neg ^ 1);
          }
          local_258.fpclass = cpp_dec_float_finite;
          local_258.prec_elem = 10;
          local_258.data._M_elems[0] = 0;
          local_258.data._M_elems[1] = 0;
          local_258.data._M_elems[2] = 0;
          local_258.data._M_elems[3] = 0;
          local_258.data._M_elems[4] = 0;
          local_258.data._M_elems[5] = 0;
          local_258.data._M_elems._24_5_ = 0;
          local_258.data._M_elems[7]._1_3_ = 0;
          local_258.data._M_elems._32_5_ = 0;
          local_258.data._M_elems[9]._1_3_ = 0;
          local_258.exp = 0;
          local_258.neg = false;
          local_168.data._M_elems._0_8_ = uVar6;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_258,&local_168,v);
          local_128.m_backend.data._M_elems[9]._1_3_ = local_258.data._M_elems[9]._1_3_;
          local_128.m_backend.data._M_elems._32_5_ = local_258.data._M_elems._32_5_;
          local_298.data._M_elems._32_5_ = local_258.data._M_elems._32_5_;
          local_298.data._M_elems[9]._1_3_ = local_258.data._M_elems[9]._1_3_;
          local_128.m_backend.data._M_elems[7]._1_3_ = local_258.data._M_elems[7]._1_3_;
          local_128.m_backend.data._M_elems._24_5_ = local_258.data._M_elems._24_5_;
          local_298.data._M_elems[4] = local_258.data._M_elems[4];
          local_298.data._M_elems[5] = local_258.data._M_elems[5];
          local_298.data._M_elems._24_5_ = local_258.data._M_elems._24_5_;
          local_298.data._M_elems[7]._1_3_ = local_258.data._M_elems[7]._1_3_;
          local_298.data._M_elems[0] = local_258.data._M_elems[0];
          local_298.data._M_elems[1] = local_258.data._M_elems[1];
          local_298.data._M_elems[2] = local_258.data._M_elems[2];
          local_298.data._M_elems[3] = local_258.data._M_elems[3];
          local_298.exp = local_258.exp;
          local_298.neg = local_258.neg;
          local_128.m_backend.fpclass = local_258.fpclass;
          local_128.m_backend.prec_elem = local_258.prec_elem;
          local_298.fpclass = local_258.fpclass;
          local_298.prec_elem = local_258.prec_elem;
          local_128.m_backend.data._M_elems[0] = local_258.data._M_elems[0];
          local_128.m_backend.data._M_elems[1] = local_258.data._M_elems[1];
          local_128.m_backend.data._M_elems[2] = local_258.data._M_elems[2];
          local_128.m_backend.data._M_elems[3] = local_258.data._M_elems[3];
          local_128.m_backend.data._M_elems[4] = local_258.data._M_elems[4];
          local_128.m_backend.data._M_elems[5] = local_258.data._M_elems[5];
          local_128.m_backend.exp = local_258.exp;
          local_128.m_backend.neg = local_258.neg;
          local_e8.m_backend.data._M_elems._32_8_ =
               *(undefined8 *)((local_1c0->m_backend).data._M_elems + 8);
          local_e8.m_backend.data._M_elems._0_8_ =
               *(undefined8 *)(local_1c0->m_backend).data._M_elems;
          local_e8.m_backend.data._M_elems._8_8_ =
               *(undefined8 *)((local_1c0->m_backend).data._M_elems + 2);
          local_e8.m_backend.data._M_elems._16_8_ =
               *(undefined8 *)((local_1c0->m_backend).data._M_elems + 4);
          local_e8.m_backend.data._M_elems._24_8_ =
               *(undefined8 *)((local_1c0->m_backend).data._M_elems + 6);
          local_e8.m_backend.exp = (local_1c0->m_backend).exp;
          local_e8.m_backend.neg = (local_1c0->m_backend).neg;
          local_e8.m_backend.fpclass = (local_1c0->m_backend).fpclass;
          local_e8.m_backend.prec_elem = (local_1c0->m_backend).prec_elem;
          bVar11 = isNotZero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
                             (&local_128,&local_e8);
          if (bVar11) {
            *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
                 CONCAT35(local_298.data._M_elems[9]._1_3_,local_298.data._M_elems._32_5_);
            *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_298.data._M_elems._16_8_;
            *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
                 CONCAT35(local_298.data._M_elems[7]._1_3_,local_298.data._M_elems._24_5_);
            *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_298.data._M_elems._0_8_;
            *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_298.data._M_elems._8_8_;
            (pnVar1->m_backend).exp = local_298.exp;
            (pnVar1->m_backend).neg = local_298.neg;
            (pnVar1->m_backend).fpclass = local_298.fpclass;
            (pnVar1->m_backend).prec_elem = local_298.prec_elem;
            enQueueMin(local_218,&local_29c,local_1c8[local_170]);
          }
        }
        else {
          local_258.fpclass = cpp_dec_float_finite;
          local_258.prec_elem = 10;
          local_258.data._M_elems[0] = 0;
          local_258.data._M_elems[1] = 0;
          local_258.data._M_elems[2] = 0;
          local_258.data._M_elems[3] = 0;
          local_258.data._M_elems[4] = 0;
          local_258.data._M_elems[5] = 0;
          local_258.data._M_elems._24_5_ = 0;
          local_258.data._M_elems[7]._1_3_ = 0;
          local_258.data._M_elems._32_5_ = 0;
          local_258.data._M_elems[9]._1_3_ = 0;
          local_258.exp = 0;
          local_258.neg = false;
          boost::multiprecision::default_ops::
          eval_multiply_default<boost::multiprecision::backends::cpp_dec_float<50u,int,void>>
                    (&local_258,&local_208,v);
          boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator-=
                    (&local_298,&local_258);
          local_168.data._M_elems._0_8_ = local_168.data._M_elems._0_8_ & 0xffffffff00000000;
          tVar12 = boost::multiprecision::operator!=
                             ((number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                               *)&local_298,(int *)&local_168);
          if (tVar12) {
            local_258.data._M_elems._32_5_ = local_298.data._M_elems._32_5_;
            local_258.data._M_elems[9]._1_3_ = local_298.data._M_elems[9]._1_3_;
            local_258.data._M_elems[4] = local_298.data._M_elems[4];
            local_258.data._M_elems[5] = local_298.data._M_elems[5];
            local_258.data._M_elems._24_5_ = local_298.data._M_elems._24_5_;
            local_258.data._M_elems[7]._1_3_ = local_298.data._M_elems[7]._1_3_;
            local_258.data._M_elems[0] = local_298.data._M_elems[0];
            local_258.data._M_elems[1] = local_298.data._M_elems[1];
            local_258.data._M_elems[2] = local_298.data._M_elems[2];
            local_258.data._M_elems[3] = local_298.data._M_elems[3];
            pcVar7 = &local_298;
            pcVar8 = &local_298;
            pcVar9 = &local_298;
            pcVar10 = &local_298;
          }
          else {
            boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<double>
                      (&local_258,1e-100,(type *)0x0);
            pcVar7 = &local_258;
            pcVar8 = &local_258;
            pcVar9 = &local_258;
            pcVar10 = &local_258;
          }
          iVar3 = pcVar7->exp;
          bVar11 = pcVar8->neg;
          fVar4 = pcVar9->fpclass;
          iVar5 = pcVar10->prec_elem;
          *(ulong *)((pnVar1->m_backend).data._M_elems + 8) =
               CONCAT35(local_258.data._M_elems[9]._1_3_,local_258.data._M_elems._32_5_);
          *(undefined8 *)((pnVar1->m_backend).data._M_elems + 4) = local_258.data._M_elems._16_8_;
          *(ulong *)((pnVar1->m_backend).data._M_elems + 6) =
               CONCAT35(local_258.data._M_elems[7]._1_3_,local_258.data._M_elems._24_5_);
          *(undefined8 *)(pnVar1->m_backend).data._M_elems = local_258.data._M_elems._0_8_;
          *(undefined8 *)((pnVar1->m_backend).data._M_elems + 2) = local_258.data._M_elems._8_8_;
          (pnVar1->m_backend).exp = iVar3;
          (pnVar1->m_backend).neg = bVar11;
          (pnVar1->m_backend).fpclass = fVar4;
          (pnVar1->m_backend).prec_elem = iVar5;
        }
        v = v + 1;
      }
    }
  }
  return;
}

Assistant:

void CLUFactor<R>::solveUleftNoNZ(R eps, R* vec,
                                  R* rhs, int* rhsidx, int rhsn)
{
   R x, y;
   int i, j, k, r, c;
   int* rorig, *corig, *cperm;
   int* ridx, *rlen, *rbeg, *idx;
   R* rval, *val;

   rorig = row.orig;
   corig = col.orig;
   cperm = col.perm;

   /*  move rhsidx to a heap
    */

   for(i = 0; i < rhsn;)
      enQueueMin(rhsidx, &i, cperm[rhsidx[i]]);

   ridx = u.row.idx;

   rval = u.row.val.data();

   rlen = u.row.len;

   rbeg = u.row.start;

   while(rhsn > 0)
   {
      i = deQueueMin(rhsidx, &rhsn);
      assert(i >= 0 && i < thedim);
      c = corig[i];
      assert(c >= 0 && c < thedim);
      x = rhs[c];
      rhs[c] = 0;

      if(isNotZero(x, eps))
      {
         r = rorig[i];
         assert(r >= 0 && r < thedim);
         x *= diag[r];
         vec[r] = x;
         k = rbeg[r];
         assert(k >= 0 && k < u.row.size);
         idx = &ridx[k];
         val = &rval[k];

         for(int m = rlen[r]; m; --m)
         {
            j = *idx++;
            assert(j >= 0 && j < thedim);
            y = rhs[j];

            if(y == 0)
            {
               y = -x * (*val++);

               if(isNotZero(y, eps))
               {
                  rhs[j] = y;
                  enQueueMin(rhsidx, &rhsn, cperm[j]);
               }
            }
            else
            {
               y -= x * (*val++);
               rhs[j] = (y != 0) ? y : SOPLEX_FACTOR_MARKER;
            }
         }
      }
   }
}